

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  cmTarget *pcVar1;
  mapped_type *ppcVar2;
  cmGlobalGenerator *this_00;
  cmTarget *local_40 [3];
  auto_ptr<cmTarget> local_28;
  auto_ptr<cmTarget> target;
  bool global_local;
  TargetType type_local;
  string *name_local;
  cmMakefile *this_local;
  
  target.x_._3_1_ = global;
  target.x_._4_4_ = type;
  pcVar1 = (cmTarget *)operator_new(0x328);
  cmTarget::cmTarget(pcVar1);
  cmsys::auto_ptr<cmTarget>::auto_ptr(&local_28,pcVar1);
  pcVar1 = cmsys::auto_ptr<cmTarget>::operator->(&local_28);
  cmTarget::SetType(pcVar1,target.x_._4_4_,name);
  pcVar1 = cmsys::auto_ptr<cmTarget>::operator->(&local_28);
  cmTarget::MarkAsImported(pcVar1);
  pcVar1 = cmsys::auto_ptr<cmTarget>::operator->(&local_28);
  cmTarget::SetMakefile(pcVar1,this);
  pcVar1 = cmsys::auto_ptr<cmTarget>::get(&local_28);
  ppcVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
            ::operator[](&this->ImportedTargets,name);
  *ppcVar2 = pcVar1;
  if ((target.x_._3_1_ & 1) != 0) {
    this_00 = GetGlobalGenerator(this);
    pcVar1 = cmsys::auto_ptr<cmTarget>::get(&local_28);
    cmGlobalGenerator::AddTarget(this_00,pcVar1);
  }
  local_40[0] = cmsys::auto_ptr<cmTarget>::get(&local_28);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
            (&this->ImportedTargetsOwned,local_40);
  pcVar1 = cmsys::auto_ptr<cmTarget>::release(&local_28);
  cmsys::auto_ptr<cmTarget>::~auto_ptr(&local_28);
  return pcVar1;
}

Assistant:

cmTarget*
cmMakefile::AddImportedTarget(const std::string& name,
                              cmTarget::TargetType type,
                              bool global)
{
  // Create the target.
  cmsys::auto_ptr<cmTarget> target(new cmTarget);
  target->SetType(type, name);
  target->MarkAsImported();
  target->SetMakefile(this);

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  if(global)
    {
    this->GetGlobalGenerator()->AddTarget(target.get());
    }

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(target.get());
  return target.release();
}